

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

int assert_str_eq(char *a,char *b,char *testcase,int line)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = test_counter + 1;
  test_counter = uVar2;
  iVar1 = strcmp(a,b);
  if (iVar1 == 0) {
    printf("ok %d - %s...\n",(ulong)uVar2,testcase);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)uVar2,testcase);
    printf("# Expected \'%s\', but observed \'%s\' instead (line %d)\n",a,b,(ulong)(uint)line);
    global_err = global_err + 1;
  }
  return iVar1;
}

Assistant:

int assert_str_eq(const char *a, const char *b, const char *testcase, int line)
{
    test_counter++;
    int err = strcmp(a,b);
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected '%s', but observed '%s' instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}